

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O1

int __thiscall FNodeBuilder::Heuristic(FNodeBuilder *this,node_t *node,DWORD set,bool honorNoSplit)

{
  FPrivVert *pFVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint *puVar6;
  byte bVar7;
  int iVar8;
  undefined7 in_register_00000009;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  FPrivSeg *seg;
  TArray<int,_int> *this_00;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  int specialSegs [2];
  int realSegs [2];
  int counts [2];
  int sidev [2];
  int local_88 [7];
  undefined4 local_6c;
  ulong local_68;
  TArray<int,_int> *local_60;
  uint *local_58;
  TArray<int,_int> *local_50;
  uint *local_48;
  int local_40;
  int local_3c;
  uint *local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000009,honorNoSplit);
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_48 = &(this->Touched).Count;
  if ((this->Touched).Count != 0) {
    *local_48 = 0;
  }
  local_58 = &(this->Colinear).Count;
  if ((this->Colinear).Count != 0) {
    *local_58 = 0;
  }
  local_50 = &this->Touched;
  local_60 = &this->Colinear;
  iVar12 = 1000000;
  bVar2 = false;
  local_68 = 0;
  do {
    if (set == 0xffffffff) {
      if (local_88[5] == 0 || local_88[4] == 0) {
        return 0;
      }
      if (local_88[3] == 0 || local_88[2] == 0) {
        return -1;
      }
      if ((byte)local_6c != '\0') {
        if (local_88[0] == local_88[2]) {
          return -1;
        }
        if (local_88[1] == local_88[3]) {
          return -1;
        }
      }
      uVar11 = (ulong)*local_48;
      uVar5 = *local_58;
      if (uVar11 != 0 && uVar5 == 0) {
        return -1;
      }
      if (uVar11 != 0) {
        uVar13 = 0;
        do {
          uVar14 = 0;
          if (uVar5 != 0) {
            uVar15 = 0;
            do {
              if (local_50->Array[uVar13] == local_60->Array[uVar15]) goto LAB_004ca54f;
              uVar15 = uVar15 + 1;
            } while (uVar5 != (uint)uVar15);
            uVar15 = (ulong)uVar5;
LAB_004ca54f:
            uVar14 = (uint)uVar15;
          }
          if (uVar14 == uVar5) {
            return -1;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar11);
      }
      if ((node->dx == 0) || (node->dy == 0)) {
        iVar10 = (int)local_68;
        if (bVar2) {
          iVar12 = iVar12 + iVar10 * 8;
        }
        else {
          iVar8 = iVar10 + 0xf;
          if (-1 < iVar10) {
            iVar8 = iVar10;
          }
          iVar12 = iVar12 + (iVar8 >> 4);
        }
      }
      iVar8 = local_88[4] - local_88[5];
      iVar10 = -iVar8;
      if (iVar8 < 1) {
        iVar10 = iVar8;
      }
      return iVar12 + local_88[5] + local_88[4] + iVar10;
    }
    seg = (this->Segs).Array + set;
    uVar5 = 1;
    if (this->HackSeg != set) {
      pFVar1 = (this->Vertices).Array;
      uVar5 = ClassifyLine2(node,&pFVar1[seg->v1].super_FSimpleVert,
                            &pFVar1[seg->v2].super_FSimpleVert,&local_40);
    }
    iVar10 = seg->loopnum;
    bVar7 = iVar10 != 0 & (byte)local_6c;
    bVar4 = bVar2;
    if (uVar5 < 2) {
      if ((bVar7 != 0) && (local_3c == 0 || local_40 == 0)) {
        if (local_3c == 0 && local_40 == 0) {
          uVar14 = *local_58;
          if (uVar14 == 0) {
            uVar11 = 0;
          }
          else {
            uVar11 = 0;
            do {
              if (local_60->Array[uVar11] == iVar10) goto LAB_004ca40c;
              uVar11 = uVar11 + 1;
            } while (uVar14 != (uint)uVar11);
            uVar11 = (ulong)uVar14;
          }
LAB_004ca40c:
          uVar9 = (uint)uVar11;
          puVar6 = local_58;
          this_00 = local_60;
        }
        else {
          uVar14 = *local_48;
          if (uVar14 == 0) {
            uVar11 = 0;
          }
          else {
            uVar11 = 0;
            do {
              if (local_50->Array[uVar11] == iVar10) goto LAB_004ca3fe;
              uVar11 = uVar11 + 1;
            } while (uVar14 != (uint)uVar11);
            uVar11 = (ulong)uVar14;
          }
LAB_004ca3fe:
          uVar9 = (uint)uVar11;
          puVar6 = local_48;
          this_00 = local_50;
        }
        if (uVar9 == uVar14) {
          local_38 = puVar6;
          TArray<int,_int>::Grow(this_00,1);
          this_00->Array[*local_38] = seg->loopnum;
          *local_38 = *local_38 + 1;
        }
      }
      local_88[(ulong)uVar5 + 4] = local_88[(ulong)uVar5 + 4] + 1;
      if (seg->linedef == -1) {
        iVar12 = iVar12 + 2;
      }
      else {
        local_88[(ulong)uVar5 + 2] = local_88[(ulong)uVar5 + 2] + 1;
        if (seg->frontsector == seg->backsector) {
          local_88[uVar5] = local_88[uVar5] + 1;
        }
        iVar12 = iVar12 + 8;
      }
LAB_004ca46c:
      local_68 = (ulong)((int)local_68 + 1);
      set = seg->next;
      bVar3 = true;
      bVar2 = bVar4;
    }
    else {
      if (iVar10 != 0) {
        bVar4 = true;
      }
      if (bVar7 == 0) {
        dVar16 = InterceptVector(this,node,seg);
        if ((dVar16 < 0.001) || (0.999 < dVar16)) {
          pFVar1 = (this->Vertices).Array;
          dVar22 = (double)pFVar1[seg->v1].super_FSimpleVert.x;
          dVar21 = (double)pFVar1[seg->v1].super_FSimpleVert.y;
          dVar20 = (double)pFVar1[seg->v2].super_FSimpleVert.x;
          dVar18 = (dVar20 - dVar22) * dVar16 + dVar22;
          dVar19 = (double)pFVar1[seg->v2].super_FSimpleVert.y;
          dVar17 = (dVar19 - dVar21) * dVar16 + dVar21;
          if (((ABS(dVar18 - dVar22) < 7.0) && (ABS(dVar17 - dVar21) < 7.0)) ||
             ((ABS(dVar18 - dVar20) < 7.0 && (ABS(dVar17 - dVar19) < 7.0)))) {
            bVar2 = false;
          }
          else {
            iVar12 = iVar12 - (int)(1.0 / (double)(~-(ulong)(0.999 < dVar16) & (ulong)dVar16 |
                                                  (ulong)(1.0 - dVar16) & -(ulong)(0.999 < dVar16)))
            ;
            if (iVar12 < 2) {
              iVar12 = 1;
            }
            bVar2 = true;
          }
          if (!bVar2) {
            bVar3 = false;
            bVar2 = bVar4;
            goto LAB_004ca47f;
          }
        }
        local_88[5] = local_88[5] + 1;
        local_88[4] = local_88[4] + 1;
        if (seg->linedef != -1) {
          local_88[3] = local_88[3] + 1;
          local_88[2] = local_88[2] + 1;
          if (seg->frontsector == seg->backsector) {
            local_88[1] = local_88[1] + 1;
            local_88[0] = local_88[0] + 1;
          }
        }
        goto LAB_004ca46c;
      }
      bVar3 = false;
    }
LAB_004ca47f:
    if (!bVar3) {
      return -1;
    }
  } while( true );
}

Assistant:

int FNodeBuilder::Heuristic (node_t &node, DWORD set, bool honorNoSplit)
{
	// Set the initial score above 0 so that near vertex anti-weighting is less likely to produce a negative score.
	int score = 1000000;
	int segsInSet = 0;
	int counts[2] = { 0, 0 };
	int realSegs[2] = { 0, 0 };
	int specialSegs[2] = { 0, 0 };
	DWORD i = set;
	int sidev[2];
	int side;
	bool splitter = false;
	unsigned int max, m2, p, q;
	double frac;

	Touched.Clear ();
	Colinear.Clear ();

	while (i != DWORD_MAX)
	{
		const FPrivSeg *test = &Segs[i];

		if (HackSeg == i)
		{
			side = 1;
		}
		else
		{
			side = ClassifyLine (node, &Vertices[test->v1], &Vertices[test->v2], sidev);
		}
		switch (side)
		{
		case 0:	// Seg is on only one side of the partition
		case 1:
			// If we don't split this line, but it abuts the splitter, also reject it.
			// The "right" thing to do in this case is to only reject it if there is
			// another nosplit seg from the same sector at this vertex. Note that a line
			// that lies exactly on top of the splitter is okay.
			if (test->loopnum && honorNoSplit && (sidev[0] == 0 || sidev[1] == 0))
			{
				if ((sidev[0] | sidev[1]) != 0)
				{
					max = Touched.Size();
					for (p = 0; p < max; ++p)
					{
						if (Touched[p] == test->loopnum)
						{
							break;
						}
					}
					if (p == max)
					{
						Touched.Push (test->loopnum);
					}
				}
				else
				{
					max = Colinear.Size();
					for (p = 0; p < max; ++p)
					{
						if (Colinear[p] == test->loopnum)
						{
							break;
						}
					}
					if (p == max)
					{
						Colinear.Push (test->loopnum);
					}
				}
			}

			counts[side]++;
			if (test->linedef != -1)
			{
				realSegs[side]++;
				if (test->frontsector == test->backsector)
				{
					specialSegs[side]++;
				}
				// Add some weight to the score for unsplit lines
				score += SplitCost;	
			}
			else
			{
				// Minisegs don't count quite as much for nosplitting
				score += SplitCost / 4;
			}
			break;

		default:	// Seg is cut by the partition
			// If we are not allowed to split this seg, reject this splitter
			if (test->loopnum)
			{
				if (honorNoSplit)
				{
					D(Printf (PRINT_LOG, "Splits seg %d\n", i));
					return -1;
				}
				else
				{
					splitter = true;
				}
			}

			// Splitters that are too close to a vertex are bad.
			frac = InterceptVector (node, *test);
			if (frac < 0.001 || frac > 0.999)
			{
				FPrivVert *v1 = &Vertices[test->v1];
				FPrivVert *v2 = &Vertices[test->v2];
				double x = v1->x, y = v1->y;
				x += frac * (v2->x - x);
				y += frac * (v2->y - y);
				if (fabs(x - v1->x) < VERTEX_EPSILON+1 && fabs(y - v1->y) < VERTEX_EPSILON+1)
				{
					D(Printf("Splitter will produce same start vertex as seg %d\n", i));
					return -1;
				}
				if (fabs(x - v2->x) < VERTEX_EPSILON+1 && fabs(y - v2->y) < VERTEX_EPSILON+1)
				{
					D(Printf("Splitter will produce same end vertex as seg %d\n", i));
					return -1;
				}
				if (frac > 0.999)
				{
					frac = 1 - frac;
				}
				int penalty = int(1 / frac);
				score = MAX(score - penalty, 1);
				D(Printf ("Penalized splitter by %d for being near endpt of seg %d (%f).\n", penalty, i, frac));
			}

			counts[0]++;
			counts[1]++;
			if (test->linedef != -1)
			{
				realSegs[0]++;
				realSegs[1]++;
				if (test->frontsector == test->backsector)
				{
					specialSegs[0]++;
					specialSegs[1]++;
				}
			}
			break;
		}

		segsInSet++;
		i = test->next;
	}

	// If this line is outside all the others, return a special score
	if (counts[0] == 0 || counts[1] == 0)
	{
		return 0;
	}

	// A splitter must have at least one real seg on each side.
	// Otherwise, a subsector could be left without any way to easily
	// determine which sector it lies inside.
	if (realSegs[0] == 0 || realSegs[1] == 0)
	{
		D(Printf (PRINT_LOG, "Leaves a side with only mini segs\n"));
		return -1;
	}

	// Try to avoid splits that leave only "special" segs, so that the generated
	// subsectors have a better chance of choosing the correct sector. This situation
	// is not neccesarily bad, just undesirable.
	if (honorNoSplit && (specialSegs[0] == realSegs[0] || specialSegs[1] == realSegs[1]))
	{
		D(Printf (PRINT_LOG, "Leaves a side with only special segs\n"));
		return -1;
	}

	// If this splitter intersects any vertices of segs that should not be split,
	// check if it is also colinear with another seg from the same sector. If it
	// is, the splitter is okay. If not, it should be rejected. Why? Assuming that
	// polyobject containers are convex (which they should be), a splitter that
	// is colinear with one of the sector's segs and crosses the vertex of another
	// seg of that sector must be crossing the container's corner and does not
	// actually split the container.

	max = Touched.Size ();
	m2 = Colinear.Size ();

	// If honorNoSplit is false, then both these lists will be empty.

	// If the splitter touches some vertices without being colinear to any, we
	// can skip further checks and reject this right away.
	if (m2 == 0 && max > 0)
	{
		return -1;
	}

	for (p = 0; p < max; ++p)
	{
		int look = Touched[p];
		for (q = 0; q < m2; ++q)
		{
			if (look == Colinear[q])
			{
				break;
			}
		}
		if (q == m2)
		{ // Not a good one
			return -1;
		}
	}

	// Doom maps are primarily axis-aligned lines, so it's usually a good
	// idea to prefer axis-aligned splitters over diagonal ones. Doom originally
	// had special-casing for orthogonal lines, so they performed better. ZDoom
	// does not care about the line's direction, so this is merely a choice to
	// try and improve the final tree.

	if ((node.dx == 0) || (node.dy == 0))
	{
		// If we have to split a seg we would prefer to keep unsplit, give
		// extra precedence to orthogonal lines so that the polyobjects
		// outside the entrance to MAP06 in Hexen MAP02 display properly.
		if (splitter)
		{
			score += segsInSet*8;
		}
		else
		{
			score += segsInSet/AAPreference;
		}
	}

	score += (counts[0] + counts[1]) - abs(counts[0] - counts[1]);

	return score;
}